

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O1

int cfg_tobin_tokens(void *reference,char *value,cfg_schema_entry *entries,size_t entry_count,
                    cfg_schema_token_customizer *custom)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  const_strarray *pcVar4;
  const_strarray *pcVar5;
  const_strarray parameter;
  char buffer [256];
  const_strarray local_168;
  char *local_158;
  long local_150;
  size_t local_148;
  cfg_schema_token_customizer *local_140;
  char local_138 [264];
  
  local_168.value = local_138;
  lVar3 = entry_count - 1;
  local_158 = value;
  local_150 = lVar3;
  local_148 = entry_count;
  local_140 = custom;
  if (lVar3 != 0) {
    pcVar5 = &entries->def;
    do {
      if (value == (char *)0x0) {
        value = (char *)0x0;
        pcVar4 = pcVar5;
      }
      else {
        value = (char *)str_cpynextword(local_138,value,0x100);
        sVar2 = strlen(local_168.value);
        local_168.length = sVar2 + 1;
        pcVar4 = &local_168;
      }
      if (((_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)pcVar5[4].length !=
           (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
         (iVar1 = (*(_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)pcVar5[4].length)
                            ((cfg_schema_entry *)(pcVar5 + -5),pcVar4,
                             pcVar5[5].value + (long)reference), iVar1 != 0)) {
        return -1;
      }
      pcVar5 = (const_strarray *)&pcVar5[0xc].length;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (value != (char *)0x0) {
    local_168.value = value;
    sVar2 = strlen(value);
    local_168.length = sVar2 + 1;
    if ((entries[local_150].cb_to_binary !=
         (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
       (iVar1 = (*entries[local_150].cb_to_binary)
                          (entries + local_150,&local_168,
                           (void *)(entries[local_150].bin_offset + (long)reference)), iVar1 != 0))
    {
      return -1;
    }
  }
  iVar1 = 0;
  if ((local_140 != (cfg_schema_token_customizer *)0x0) &&
     (local_140->cb_tobin != (_func_int_cfg_schema_entry_ptr_size_t_char_ptr_void_ptr *)0x0)) {
    iVar1 = (*local_140->cb_tobin)(entries,local_148,local_158,reference);
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_tokens(void *reference, const char *value, struct cfg_schema_entry *entries, size_t entry_count,
  struct cfg_schema_token_customizer *custom) {
  struct const_strarray parameter, *parameter_ptr;
  const char *next_token;
  char buffer[256];
  char *dst;
  size_t i;

  dst = reference;
  next_token = value;

  parameter.value = buffer;
  for (i = 0; i < entry_count - 1; i++) {
    if (!next_token) {
      parameter_ptr = &entries[i].def;
    }
    else {
      next_token = str_cpynextword(buffer, next_token, sizeof(buffer));
      parameter.length = strlen(parameter.value) + 1;
      parameter_ptr = &parameter;
    }

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], parameter_ptr, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (next_token) {
    /* we have data for the last entry left */
    i = entry_count - 1;

    parameter.value = next_token;
    parameter.length = strlen(next_token) + 1;

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], &parameter, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (custom && custom->cb_tobin) {
    return custom->cb_tobin(entries, entry_count, value, dst);
  }
  return 0;
}